

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O2

EVP_MD * EVP_get_digestbyname(char *name)

{
  char *__s1;
  char *__s1_00;
  int iVar1;
  long lVar2;
  EVP_MD *pEVar3;
  
  lVar2 = 0x18;
  do {
    if (lVar2 == 600) {
      return (EVP_MD *)0x0;
    }
    __s1 = *(char **)((long)&kCiphers[0x15].func + lVar2);
    __s1_00 = *(char **)((long)&nid_to_digest_mapping[0].nid + lVar2);
    if (__s1 != (char *)0x0) {
      iVar1 = strcmp(__s1,name);
      if (iVar1 == 0) goto LAB_003e5ca0;
    }
    if (__s1_00 != (char *)0x0) {
      iVar1 = strcmp(__s1_00,name);
      if (iVar1 == 0) {
LAB_003e5ca0:
        pEVar3 = (EVP_MD *)(**(code **)((long)&kCiphers[0x15].name + lVar2))();
        return pEVar3;
      }
    }
    lVar2 = lVar2 + 0x20;
  } while( true );
}

Assistant:

const EVP_MD *EVP_get_digestbyname(const char *name) {
  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(nid_to_digest_mapping); i++) {
    const char *short_name = nid_to_digest_mapping[i].short_name;
    const char *long_name = nid_to_digest_mapping[i].long_name;
    if ((short_name && strcmp(short_name, name) == 0) ||
        (long_name && strcmp(long_name, name) == 0)) {
      return nid_to_digest_mapping[i].md_func();
    }
  }

  return NULL;
}